

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# mesh.cc
# Opt level: O1

void __thiscall
gvr::Mesh::Mesh(Mesh *this,Mesh *p,vector<bool,_std::allocator<bool>_> *vused,
               vector<bool,_std::allocator<bool>_> *tused)

{
  uint uVar1;
  int iVar2;
  long lVar3;
  float *pfVar4;
  uint *puVar5;
  float *pfVar6;
  uint uVar7;
  size_type __new_size;
  uint *puVar8;
  ulong uVar9;
  ulong uVar10;
  vector<unsigned_int,_std::allocator<unsigned_int>_> index;
  vector<unsigned_int,_std::allocator<unsigned_int>_> local_38;
  
  PointCloud::PointCloud(&this->super_PointCloud,&p->super_PointCloud,vused);
  (this->super_PointCloud).super_Model._vptr_Model = (_func_int **)&PTR__Mesh_00178188;
  lVar3 = (long)(this->super_PointCloud).n;
  uVar9 = 0xffffffffffffffff;
  if (-1 < lVar3) {
    uVar9 = lVar3 * 0xc;
  }
  pfVar4 = (float *)operator_new__(uVar9);
  this->normal = pfVar4;
  __new_size = (size_type)(p->super_PointCloud).n;
  if (0 < (long)__new_size) {
    lVar3 = *(long *)vused;
    pfVar6 = p->normal + 2;
    uVar9 = 0;
    uVar10 = 0;
    do {
      if ((*(ulong *)(lVar3 + (uVar9 >> 6) * 8) >> (uVar9 & 0x3f) & 1) != 0) {
        iVar2 = (int)uVar10;
        pfVar4[uVar10] = pfVar6[-2];
        pfVar4[iVar2 + 1] = pfVar6[-1];
        uVar10 = (ulong)(iVar2 + 3);
        pfVar4[iVar2 + 2] = *pfVar6;
      }
      uVar9 = uVar9 + 1;
      pfVar6 = pfVar6 + 3;
    } while (__new_size != uVar9);
  }
  local_38.super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>._M_impl.
  super__Vector_impl_data._M_start = (pointer)0x0;
  local_38.super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>._M_impl.
  super__Vector_impl_data._M_finish = (pointer)0x0;
  local_38.super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>._M_impl.
  super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
  std::vector<unsigned_int,_std::allocator<unsigned_int>_>::resize(&local_38,__new_size);
  if (0 < (p->super_PointCloud).n) {
    lVar3 = *(long *)vused;
    uVar9 = 0;
    uVar7 = 0;
    do {
      if ((*(ulong *)(lVar3 + (uVar9 >> 6) * 8) >> (uVar9 & 0x3f) & 1) != 0) {
        local_38.super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>._M_impl.
        super__Vector_impl_data._M_start[uVar9] = uVar7;
        uVar7 = uVar7 + 1;
      }
      uVar9 = uVar9 + 1;
    } while ((long)uVar9 < (long)(p->super_PointCloud).n);
  }
  this->n = 0;
  if (0 < p->n) {
    lVar3 = *(long *)tused;
    uVar9 = 0;
    do {
      if ((*(ulong *)(lVar3 + (uVar9 >> 6) * 8) >> (uVar9 & 0x3f) & 1) != 0) {
        this->n = this->n + 1;
      }
      uVar9 = uVar9 + 1;
    } while ((long)uVar9 < (long)p->n);
  }
  uVar9 = 0xffffffffffffffff;
  if (-1 < (long)this->n) {
    uVar9 = (long)this->n * 0xc;
  }
  puVar5 = (uint *)operator_new__(uVar9);
  this->triangle = puVar5;
  iVar2 = p->n;
  if (0 < (long)iVar2) {
    lVar3 = *(long *)tused;
    puVar8 = p->triangle + 2;
    uVar9 = 0;
    uVar7 = 0;
    do {
      if ((*(ulong *)(lVar3 + (uVar9 >> 6) * 8) >> (uVar9 & 0x3f) & 1) != 0) {
        puVar5[uVar7] =
             local_38.super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>._M_impl.
             super__Vector_impl_data._M_start[puVar8[-2]];
        uVar1 = uVar7 + 2;
        puVar5[uVar7 + 1] =
             local_38.super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>._M_impl.
             super__Vector_impl_data._M_start[puVar8[-1]];
        uVar7 = uVar7 + 3;
        puVar5[uVar1] =
             local_38.super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>._M_impl.
             super__Vector_impl_data._M_start[*puVar8];
      }
      uVar9 = uVar9 + 1;
      puVar8 = puVar8 + 3;
    } while ((long)iVar2 != uVar9);
  }
  if (local_38.super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>._M_impl.
      super__Vector_impl_data._M_start != (pointer)0x0) {
    operator_delete(local_38.super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>._M_impl
                    .super__Vector_impl_data._M_start);
  }
  return;
}

Assistant:

Mesh::Mesh(const Mesh &p, const std::vector<bool> &vused, const std::vector<bool> &tused)
  : PointCloud(p, vused)
{
  normal=new float [3*getVertexCount()];

  unsigned int k=0;

  for (int i=0; i<p.getVertexCount(); i++)
  {
    if (vused[i])
    {
      normal[k++]=p.getNormalComp(i, 0);
      normal[k++]=p.getNormalComp(i, 1);
      normal[k++]=p.getNormalComp(i, 2);
    }
  }

  // adapt indices of triangle vertices

  std::vector<unsigned int> index;
  index.resize(p.getVertexCount());

  k=0;

  for (int i=0; i<p.getVertexCount(); i++)
  {
    if (vused[i])
    {
      index[i]=k++;
    }
  }

  n=0;

  for (int i=0; i<p.getTriangleCount(); i++)
    if (tused[i])
    {
      n++;
    }

  triangle=new unsigned int [3*n];

  k=0;

  for (int i=0; i<p.getTriangleCount(); i++)
  {
    if (tused[i])
    {
      triangle[k++]=index[p.getTriangleIndex(i, 0)];
      triangle[k++]=index[p.getTriangleIndex(i, 1)];
      triangle[k++]=index[p.getTriangleIndex(i, 2)];
    }
  }
}